

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O1

VertexBuffer * __thiscall sf::VertexBuffer::operator=(VertexBuffer *this,VertexBuffer *right)

{
  uint uVar1;
  size_t sVar2;
  undefined8 uVar3;
  VertexBuffer local_30;
  
  VertexBuffer(&local_30,right);
  sVar2 = this->m_size;
  this->m_size = local_30.m_size;
  uVar1 = this->m_buffer;
  this->m_buffer = local_30.m_buffer;
  uVar3._0_4_ = this->m_primitiveType;
  uVar3._4_4_ = this->m_usage;
  this->m_primitiveType = local_30.m_primitiveType;
  this->m_usage = local_30.m_usage;
  local_30.m_buffer = uVar1;
  local_30.m_size = sVar2;
  local_30._24_8_ = uVar3;
  ~VertexBuffer(&local_30);
  return this;
}

Assistant:

VertexBuffer& VertexBuffer::operator =(const VertexBuffer& right)
{
    VertexBuffer temp(right);

    swap(temp);

    return *this;
}